

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cpp
# Opt level: O2

bool __thiscall
anon_unknown.dwarf_201151b::BIP32PubkeyProvider::ToNormalizedString
          (BIP32PubkeyProvider *this,SigningProvider *arg,string *out,DescriptorCache *cache)

{
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_00;
  KeyPath *this_01;
  secure_unique_ptr<KeyType> *this_02;
  long lVar1;
  bool bVar2;
  const_reference pvVar3;
  long lVar4;
  ulong uVar5;
  string *psVar6;
  CExtPubKey *pCVar7;
  size_type __n;
  ulong uVar8;
  long in_FS_OFFSET;
  byte bVar9;
  Span<const_unsigned_char> s;
  KeyPath end_path;
  KeyOriginInfo origin;
  string local_258;
  string local_238;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  string local_1d8;
  string origin_str;
  CExtKey xprv;
  CExtKey lh_xprv;
  CExtPubKey xpub;
  CKeyID id;
  
  bVar9 = 0;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->m_derive == HARDENED) {
    (anonymous_namespace)::BIP32PubkeyProvider::ToString_abi_cxx11_
              ((string *)&xpub,this,PUBLIC,true);
LAB_005b7a42:
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (out,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&xpub);
    std::__cxx11::string::~string((string *)&xpub);
    bVar2 = true;
    goto LAB_005b7e22;
  }
  this_01 = &this->m_path;
  uVar8 = (ulong)((long)(this->m_path).
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                 (long)(this->m_path).
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_start) >> 2 & 0xffffffff;
  do {
    uVar5 = uVar8;
    if ((int)uVar5 < 1) {
      if (uVar5 == 0) {
        (anonymous_namespace)::BIP32PubkeyProvider::ToString_abi_cxx11_((string *)&xpub,this,PUBLIC)
        ;
        goto LAB_005b7a42;
      }
      break;
    }
    pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at(this_01,uVar5 - 1);
    uVar8 = uVar5 - 1;
  } while (-1 < (int)*pvVar3);
  this_00 = &origin.path;
  origin.path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  origin.path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  origin.path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __n = 0;
  uVar8 = uVar5 & 0xffffffff;
  if ((int)uVar5 < 1) {
    uVar8 = __n;
  }
  for (; uVar8 != __n; __n = __n + 1) {
    pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at(this_01,__n);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(this_00,pvVar3);
  }
  end_path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  end_path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  end_path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  for (; (long)uVar8 <
         (long)(int)((ulong)((long)(this->m_path).
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_finish -
                            (long)(this->m_path).
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_start) >> 2); uVar8 = uVar8 + 1
      ) {
    pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at(this_01,uVar8);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(&end_path,pvVar3);
  }
  CPubKey::GetID(&id,(CPubKey *)&this->field_0x3c);
  origin.fingerprint[0] = id.super_uint160.super_base_blob<160U>.m_data._M_elems[0];
  origin.fingerprint[1] = id.super_uint160.super_base_blob<160U>.m_data._M_elems[1];
  origin.fingerprint[2] = id.super_uint160.super_base_blob<160U>.m_data._M_elems[2];
  origin.fingerprint[3] = id.super_uint160.super_base_blob<160U>.m_data._M_elems[3];
  xpub.chaincode.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  xpub.chaincode.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  xpub.chaincode.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  xpub.chaincode.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  xpub.chaincode.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  xpub.chaincode.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  xpub.chaincode.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  xpub.chaincode.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  xpub.chaincode.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
  xpub.chaincode.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
  xpub.chaincode.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
  xpub.chaincode.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  xpub.chaincode.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
  xpub.chaincode.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
  xpub.chaincode.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
  xpub.chaincode.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
  xpub.chaincode.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  xpub.chaincode.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  xpub.chaincode.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  xpub.chaincode.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  xpub.chaincode.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  xpub.chaincode.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  xpub.chaincode.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  xpub.chaincode.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  xpub.chaincode.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  xpub.chaincode.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  xpub.chaincode.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  xpub.chaincode.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  xpub.chaincode.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  xpub.chaincode.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  xpub.chaincode.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  xpub.chaincode.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  xpub.pubkey.vch[0] = 0xff;
  lh_xprv.chaincode.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  lh_xprv.chaincode.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  lh_xprv.chaincode.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  lh_xprv.chaincode.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  lh_xprv.chaincode.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  lh_xprv.chaincode.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  lh_xprv.chaincode.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  lh_xprv.chaincode.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  lh_xprv.chaincode.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
  lh_xprv.chaincode.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
  lh_xprv.chaincode.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
  lh_xprv.chaincode.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  lh_xprv.chaincode.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
  lh_xprv.chaincode.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
  lh_xprv.chaincode.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
  lh_xprv.chaincode.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
  lh_xprv.chaincode.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  lh_xprv.chaincode.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  lh_xprv.chaincode.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  lh_xprv.chaincode.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  lh_xprv.chaincode.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  lh_xprv.chaincode.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  lh_xprv.chaincode.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  lh_xprv.chaincode.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  lh_xprv.chaincode.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  lh_xprv.chaincode.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  lh_xprv.chaincode.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  lh_xprv.chaincode.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  lh_xprv.chaincode.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  lh_xprv.chaincode.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  lh_xprv.chaincode.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  lh_xprv.chaincode.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  lh_xprv.key.fCompressed = false;
  lh_xprv.key.keydata._M_t.
  super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl =
       (__uniq_ptr_data<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>,_true,_true>
        )(__uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
          )0x0;
  if (cache == (DescriptorCache *)0x0) {
LAB_005b7bc8:
    this_02 = &xprv.key.keydata;
    xprv.chaincode.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
    xprv.chaincode.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
    xprv.chaincode.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
    xprv.chaincode.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
    xprv.chaincode.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
    xprv.chaincode.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
    xprv.chaincode.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
    xprv.chaincode.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
    xprv.chaincode.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
    xprv.chaincode.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
    xprv.chaincode.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
    xprv.chaincode.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
    xprv.chaincode.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
    xprv.chaincode.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
    xprv.chaincode.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
    xprv.chaincode.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
    xprv.chaincode.super_base_blob<256U>.m_data._M_elems[0] = '\0';
    xprv.chaincode.super_base_blob<256U>.m_data._M_elems[1] = '\0';
    xprv.chaincode.super_base_blob<256U>.m_data._M_elems[2] = '\0';
    xprv.chaincode.super_base_blob<256U>.m_data._M_elems[3] = '\0';
    xprv.chaincode.super_base_blob<256U>.m_data._M_elems[4] = '\0';
    xprv.chaincode.super_base_blob<256U>.m_data._M_elems[5] = '\0';
    xprv.chaincode.super_base_blob<256U>.m_data._M_elems[6] = '\0';
    xprv.chaincode.super_base_blob<256U>.m_data._M_elems[7] = '\0';
    xprv.chaincode.super_base_blob<256U>.m_data._M_elems[8] = '\0';
    xprv.chaincode.super_base_blob<256U>.m_data._M_elems[9] = '\0';
    xprv.chaincode.super_base_blob<256U>.m_data._M_elems[10] = '\0';
    xprv.chaincode.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
    xprv.chaincode.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
    xprv.chaincode.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
    xprv.chaincode.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
    xprv.chaincode.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
    xprv.key.fCompressed = false;
    xprv.key.keydata._M_t.
    super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
    .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl =
         (__uniq_ptr_data<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>,_true,_true>
          )(__uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
            )0x0;
    bVar2 = GetDerivedExtKey(this,arg,&xprv,&lh_xprv);
    if (bVar2) {
      CExtKey::Neuter((CExtPubKey *)&origin_str,&lh_xprv);
      psVar6 = &origin_str;
      pCVar7 = &xpub;
      for (lVar4 = 0x71; lVar4 != 0; lVar4 = lVar4 + -1) {
        pCVar7->version[0] = *(uchar *)&(psVar6->_M_dataplus)._M_p;
        psVar6 = (string *)((long)psVar6 + (ulong)bVar9 * -2 + 1);
        pCVar7 = (CExtPubKey *)((long)pCVar7 + (ulong)bVar9 * -2 + 1);
      }
      std::
      unique_ptr<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
      ::~unique_ptr(this_02);
      if ((xpub.pubkey.vch[0] & 0xfe) != 2) goto LAB_005b7c49;
      goto LAB_005b7c62;
    }
    std::
    unique_ptr<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
    ::~unique_ptr(this_02);
    bVar2 = false;
  }
  else {
    DescriptorCache::GetCachedLastHardenedExtPubKey
              (cache,(this->super_PubkeyProvider).m_expr_index,&xpub);
    if ((xpub.pubkey.vch[0] & 0xfe) != 2) {
      if ((7 < xpub.pubkey.vch[0]) || ((0xd0U >> (xpub.pubkey.vch[0] & 0x1f) & 1) == 0))
      goto LAB_005b7bc8;
LAB_005b7c49:
      if ((7 < xpub.pubkey.vch[0]) || ((0xd0U >> (xpub.pubkey.vch[0] & 0x1f) & 1) == 0)) {
        __assert_fail("xpub.pubkey.IsValid()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/descriptor.cpp"
                      ,0x21e,
                      "virtual bool (anonymous namespace)::BIP32PubkeyProvider::ToNormalizedString(const SigningProvider &, std::string &, const DescriptorCache *) const"
                     );
      }
    }
LAB_005b7c62:
    s.m_size = 4;
    s.m_data = origin.fingerprint;
    HexStr_abi_cxx11_((string *)&xprv,s);
    FormatHDKeypath_abi_cxx11_(&local_1d8,this_00,false);
    std::operator+(&origin_str,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&xprv,
                   &local_1d8);
    std::__cxx11::string::~string((string *)&local_1d8);
    std::__cxx11::string::~string((string *)&xprv);
    std::operator+(&local_218,"[",&origin_str);
    std::operator+(&local_1f8,&local_218,"]");
    EncodeExtPubKey_abi_cxx11_(&local_238,&xpub);
    std::operator+(&local_1d8,&local_1f8,&local_238);
    FormatHDKeypath_abi_cxx11_(&local_258,&end_path,false);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&xprv,
                   &local_1d8,&local_258);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (out,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&xprv);
    std::__cxx11::string::~string((string *)&xprv);
    std::__cxx11::string::~string((string *)&local_258);
    std::__cxx11::string::~string((string *)&local_1d8);
    std::__cxx11::string::~string((string *)&local_238);
    std::__cxx11::string::~string((string *)&local_1f8);
    std::__cxx11::string::~string((string *)&local_218);
    if ((this->m_derive != NO) &&
       (std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  (out,"/*"), this->m_derive != UNHARDENED)) {
      __assert_fail("m_derive == DeriveType::UNHARDENED",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/descriptor.cpp"
                    ,0x225,
                    "virtual bool (anonymous namespace)::BIP32PubkeyProvider::ToNormalizedString(const SigningProvider &, std::string &, const DescriptorCache *) const"
                   );
    }
    std::__cxx11::string::~string((string *)&origin_str);
    bVar2 = true;
  }
  std::
  unique_ptr<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  ::~unique_ptr(&lh_xprv.key.keydata);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&end_path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&this_00->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
LAB_005b7e22:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return bVar2;
}

Assistant:

bool ToNormalizedString(const SigningProvider& arg, std::string& out, const DescriptorCache* cache) const override
    {
        if (m_derive == DeriveType::HARDENED) {
            out = ToString(StringType::PUBLIC, /*normalized=*/true);

            return true;
        }
        // Step backwards to find the last hardened step in the path
        int i = (int)m_path.size() - 1;
        for (; i >= 0; --i) {
            if (m_path.at(i) >> 31) {
                break;
            }
        }
        // Either no derivation or all unhardened derivation
        if (i == -1) {
            out = ToString();
            return true;
        }
        // Get the path to the last hardened stup
        KeyOriginInfo origin;
        int k = 0;
        for (; k <= i; ++k) {
            // Add to the path
            origin.path.push_back(m_path.at(k));
        }
        // Build the remaining path
        KeyPath end_path;
        for (; k < (int)m_path.size(); ++k) {
            end_path.push_back(m_path.at(k));
        }
        // Get the fingerprint
        CKeyID id = m_root_extkey.pubkey.GetID();
        std::copy(id.begin(), id.begin() + 4, origin.fingerprint);

        CExtPubKey xpub;
        CExtKey lh_xprv;
        // If we have the cache, just get the parent xpub
        if (cache != nullptr) {
            cache->GetCachedLastHardenedExtPubKey(m_expr_index, xpub);
        }
        if (!xpub.pubkey.IsValid()) {
            // Cache miss, or nor cache, or need privkey
            CExtKey xprv;
            if (!GetDerivedExtKey(arg, xprv, lh_xprv)) return false;
            xpub = lh_xprv.Neuter();
        }
        assert(xpub.pubkey.IsValid());

        // Build the string
        std::string origin_str = HexStr(origin.fingerprint) + FormatHDKeypath(origin.path);
        out = "[" + origin_str + "]" + EncodeExtPubKey(xpub) + FormatHDKeypath(end_path);
        if (IsRange()) {
            out += "/*";
            assert(m_derive == DeriveType::UNHARDENED);
        }
        return true;
    }